

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableHeterogeneousLookupTest_HeterogeneousFindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableHeterogeneousLookupTest_HeterogeneousFindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertionResult *assertion_result;
  char *actual_predicate_value;
  char *expected_predicate_value;
  AssertHelper *this_01;
  char *pcVar5;
  long in_RDI;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__14;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__4;
  TypeParam ht;
  AssertionResult gtest_ar_2;
  const_iterator it;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  const_eq_pair;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  eq_pair;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb38;
  const_iterator *this_02;
  undefined4 in_stack_ffffffffffffeb40;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffeb44;
  int index;
  undefined4 in_stack_ffffffffffffeb48;
  undefined4 uVar7;
  int in_stack_ffffffffffffeb4c;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb50;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_03;
  char *in_stack_ffffffffffffeb58;
  int iVar8;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  *this_04;
  undefined4 in_stack_ffffffffffffeb60;
  undefined4 in_stack_ffffffffffffeb64;
  undefined8 in_stack_ffffffffffffeb68;
  Type type;
  AssertHelper *in_stack_ffffffffffffeb70;
  undefined4 in_stack_ffffffffffffeb78;
  undefined4 in_stack_ffffffffffffeb7c;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb80;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_05;
  char *in_stack_ffffffffffffeba0;
  char *in_stack_ffffffffffffeba8;
  undefined4 in_stack_ffffffffffffebb0;
  undefined4 in_stack_ffffffffffffebb4;
  AssertionResult *in_stack_ffffffffffffebb8;
  undefined4 in_stack_ffffffffffffebc0;
  undefined4 in_stack_ffffffffffffebc4;
  int *in_stack_ffffffffffffec08;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffec10;
  string local_1200 [55];
  undefined1 local_11c9;
  AssertionResult local_11c8;
  int local_11b4;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_11b0;
  int local_115c;
  AssertHelper *local_1158;
  undefined4 local_114c;
  AssertionResult local_1148;
  string local_1138 [48];
  const_iterator local_1108;
  int local_10e4;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_10e0;
  undefined1 local_10b9;
  AssertionResult local_10b8;
  string local_10a8 [55];
  undefined1 local_1071;
  AssertionResult local_1070;
  int local_105c;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_1058;
  int local_1004;
  char *local_1000;
  undefined4 local_ff4;
  AssertionResult local_ff0;
  string local_fe0 [48];
  const_iterator local_fb0;
  int local_f8c;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_f88;
  undefined1 local_f61;
  AssertionResult local_f60;
  string local_f50 [55];
  undefined1 local_f19;
  AssertionResult local_f18;
  int local_f04;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_f00;
  int local_eac;
  type_conflict1 local_ea8;
  undefined4 local_e9c;
  AssertionResult local_e98;
  string local_e88 [48];
  const_iterator local_e58;
  int local_e34;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_e30;
  undefined1 local_e09;
  AssertionResult local_e08;
  string local_df8 [55];
  undefined1 local_dc1;
  AssertionResult local_dc0;
  int local_dac;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_da8;
  int local_d54;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_d50;
  undefined4 local_d44;
  AssertionResult local_d40;
  string local_d30 [48];
  const_iterator local_d00;
  int local_cdc;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_cd8;
  undefined1 local_cb1;
  AssertionResult local_cb0;
  string local_ca0 [55];
  undefined1 local_c69;
  AssertionResult local_c68 [2];
  key_type local_c48;
  key_type local_c40;
  AssertionResult local_c38;
  string local_c28 [55];
  undefined1 local_bf1;
  AssertionResult local_bf0;
  int local_bdc;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_bd8;
  int local_b84;
  type_conflict1 local_b80;
  undefined4 local_b74;
  AssertionResult local_b70;
  string local_b60 [48];
  const_iterator local_b30;
  int local_b0c;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_b08;
  undefined1 local_ae1;
  AssertionResult local_ae0;
  string local_ad0 [55];
  undefined1 local_a99;
  AssertionResult local_a98 [2];
  key_type local_a78;
  key_type local_a70;
  AssertionResult local_a68;
  string local_a58 [55];
  undefined1 local_a21;
  AssertionResult local_a20;
  int local_a0c;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_a08;
  int local_9b4;
  type_conflict1 local_9b0;
  undefined4 local_9a4;
  AssertionResult local_9a0;
  string local_990 [48];
  const_iterator local_960;
  int local_93c;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_938;
  undefined1 local_911;
  AssertionResult local_910;
  string local_900 [55];
  undefined1 local_8c9;
  AssertionResult local_8c8 [2];
  key_type local_8a8;
  key_type local_8a0;
  AssertionResult local_898;
  string local_888 [55];
  undefined1 local_851;
  AssertionResult local_850;
  int local_83c;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_838;
  int local_7e4;
  type_conflict1 local_7e0;
  undefined4 local_7d4;
  AssertionResult local_7d0;
  string local_7c0 [48];
  const_iterator local_790;
  int local_76c;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_768;
  undefined1 local_741;
  AssertionResult local_740;
  string local_730 [55];
  undefined1 local_6f9;
  AssertionResult local_6f8 [2];
  key_type local_6d8;
  key_type local_6d0;
  AssertionResult local_6c8;
  string local_6b8 [55];
  undefined1 local_681;
  AssertionResult local_680;
  int local_66c;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_668;
  int local_614;
  type_conflict1 local_610;
  undefined4 local_604;
  AssertionResult local_600;
  string local_5f0 [48];
  const_iterator local_5c0;
  int local_59c;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_598;
  undefined1 local_571;
  AssertionResult local_570 [10];
  key_type local_4c8;
  key_type local_4c0;
  AssertionResult local_4b8;
  int local_4a4;
  const_iterator *local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_488;
  const_iterator local_480;
  size_type local_450;
  undefined4 local_444;
  AssertionResult local_440 [3];
  value_type local_408;
  value_type local_3d8;
  value_type local_3a8;
  value_type local_378;
  value_type local_348;
  value_type local_318;
  value_type local_2e8;
  value_type local_2b8;
  string local_2b0 [55];
  byte local_279;
  AssertionResult local_278 [3];
  value_type local_240;
  string local_238 [55];
  undefined1 local_201;
  AssertionResult local_200;
  int local_1ec;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_1e8;
  int local_194;
  type_conflict1 local_190;
  undefined4 local_184;
  AssertionResult local_180;
  string local_170 [48];
  const_iterator local_140;
  int local_11c;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_118;
  undefined1 local_f1;
  AssertionResult local_f0;
  string local_e0 [71];
  undefined1 local_99;
  AssertionResult local_98;
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_88;
  undefined1 local_48 [72];
  
  type = (Type)((ulong)in_stack_ffffffffffffeb68 >> 0x20);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
              *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
  local_99 = google::
             BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xdbfd3a);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
             (bool *)in_stack_ffffffffffffeb38,(type *)0xdbfd5c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)in_stack_ffffffffffffeb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
    std::__cxx11::string::~string(local_e0);
    testing::Message::~Message((Message *)0xdbfe1d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdbfeb4);
  local_11c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find<int>(in_stack_ffffffffffffeb80,
              (int *)CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb80);
  local_f1 = google::
             dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator==(&local_118,&local_140);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
             (bool *)in_stack_ffffffffffffeb38,(type *)0xdbff49);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)in_stack_ffffffffffffeb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
    std::__cxx11::string::~string(local_170);
    testing::Message::~Message((Message *)0xdc001c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc00b3);
  local_184 = 0;
  local_194 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  local_190 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count<int>((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                           (int *)in_stack_ffffffffffffeb38);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)in_stack_ffffffffffffeb50,
             (uint *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc0174);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)in_stack_ffffffffffffeb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
    testing::Message::~Message((Message *)0xdc01d7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc0248);
  local_1ec = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range<int>(in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)local_48,&local_1e8);
  local_201 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(const_iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
             (bool *)in_stack_ffffffffffffeb38,(type *)0xdc02dd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)in_stack_ffffffffffffeb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
    std::__cxx11::string::~string(local_238);
    testing::Message::~Message((Message *)0xdc03b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc0447);
  local_240 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb38,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
           (value_type *)in_stack_ffffffffffffebb8);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xdc049e);
  local_279 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
             (bool *)in_stack_ffffffffffffeb38,(type *)0xdc04c2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_278);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)in_stack_ffffffffffffeb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
    std::__cxx11::string::~string(local_2b0);
    testing::Message::~Message((Message *)0xdc0595);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc062c);
  local_2b8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb38,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
           (value_type *)in_stack_ffffffffffffebb8);
  local_2e8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb38,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
           (value_type *)in_stack_ffffffffffffebb8);
  local_318 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb38,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
           (value_type *)in_stack_ffffffffffffebb8);
  local_348 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb38,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
           (value_type *)in_stack_ffffffffffffebb8);
  local_378 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb38,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
           (value_type *)in_stack_ffffffffffffebb8);
  local_3a8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb38,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
           (value_type *)in_stack_ffffffffffffebb8);
  local_3d8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb38,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
           (value_type *)in_stack_ffffffffffffebb8);
  local_408 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb38,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
           (value_type *)in_stack_ffffffffffffebb8);
  local_444 = 9;
  local_450 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xdc0878);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)in_stack_ffffffffffffeb50,
             (uint *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_440);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc08f1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)in_stack_ffffffffffffeb50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
    testing::Message::~Message((Message *)0xdc0954);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc09c5);
  local_4a4 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find<int>(in_stack_ffffffffffffeb80,
              (int *)CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78));
  uVar6 = (undefined4)local_498;
  index = (int)((ulong)local_498 >> 0x20);
  uVar7 = (undefined4)local_490;
  iVar4 = (int)((ulong)local_490 >> 0x20);
  it_00.super_iterator.pos._0_4_ = uVar6;
  it_00.super_iterator.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_4a0;
  it_00.super_iterator.pos._4_4_ = index;
  it_00.super_iterator.end._0_4_ = uVar7;
  it_00.super_iterator.end._4_4_ = iVar4;
  it_00.parent_ =
       (BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        *)local_488;
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(&local_480,it_00);
  local_4c0 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key(local_4a0);
  local_4c8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(iVar4,uVar7),index);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)local_488,(pair<int,_int> *)CONCAT44(iVar4,uVar7),
             (pair<int,_int> *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b8);
  this_02 = local_4a0;
  this_03 = local_488;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc0ae1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)local_488);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc0b44);
    this_02 = local_4a0;
    this_03 = local_488;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc0bb5);
  google::
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(index,uVar6),
             (HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)this_02);
  local_59c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find<int>(in_stack_ffffffffffffeb80,
              (int *)CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb80);
  local_571 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_598,&local_5c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc0c6e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_570);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_5f0);
    testing::Message::~Message((Message *)0xdc0d5c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc0df3);
  local_604 = 1;
  local_614 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  local_610 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count<int>((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(index,uVar6),(int *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(uint *)CONCAT44(iVar4,uVar7),
             (unsigned_long *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_600);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc0ed8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc0f3b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc0fac);
  local_66c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range<int>(in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)local_48,&local_668);
  local_681 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(const_iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc1055);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_680);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_6b8);
    testing::Message::~Message((Message *)0xdc112a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc11c1);
  local_6d0 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)this_02);
  local_6d8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(iVar4,uVar7),index);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(pair<int,_int> *)CONCAT44(iVar4,uVar7),
             (pair<int,_int> *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc1287);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc12ea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc1358);
  google::
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(index,uVar6));
  local_6f9 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(const_iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc139c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_730);
    testing::Message::~Message((Message *)0xdc1471);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc1508);
  local_76c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find<int>(in_stack_ffffffffffffeb80,
              (int *)CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb80);
  local_741 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_768,&local_790);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc159c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_740);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_7c0);
    testing::Message::~Message((Message *)0xdc1671);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc1708);
  local_7d4 = 1;
  local_7e4 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  local_7e0 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count<int>((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(index,uVar6),(int *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(uint *)CONCAT44(iVar4,uVar7),
             (unsigned_long *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc17de);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc1841);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc18b2);
  local_83c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range<int>(in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_838);
  local_851 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc194c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_850);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_888);
    testing::Message::~Message((Message *)0xdc1a21);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc1ab8);
  local_8a0 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key(this_02);
  local_8a8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(iVar4,uVar7),index);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(pair<int,_int> *)CONCAT44(iVar4,uVar7),
             (pair<int,_int> *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_898);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc1b7e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc1be1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc1c4f);
  google::
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(index,uVar6));
  local_8c9 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc1c93);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_900);
    testing::Message::~Message((Message *)0xdc1d68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc1dff);
  local_93c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find<int>(in_stack_ffffffffffffeb80,
              (int *)CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb80);
  local_911 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_938,&local_960);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc1ea6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_910);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_990);
    testing::Message::~Message((Message *)0xdc1f7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc2012);
  local_9a4 = 1;
  local_9b4 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  local_9b0 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count<int>((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(index,uVar6),(int *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(uint *)CONCAT44(iVar4,uVar7),
             (unsigned_long *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc20f7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc215a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc21cb);
  local_a0c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range<int>(in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)local_48,&local_a08);
  local_a21 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(const_iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc2274);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_a58);
    testing::Message::~Message((Message *)0xdc2349);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc23e0);
  local_a70 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)this_02);
  local_a78 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(iVar4,uVar7),index);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(pair<int,_int> *)CONCAT44(iVar4,uVar7),
             (pair<int,_int> *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc24a6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc2509);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc2577);
  google::
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(index,uVar6));
  local_a99 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(const_iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc25bb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_ad0);
    testing::Message::~Message((Message *)0xdc2690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc2727);
  local_b0c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find<int>(in_stack_ffffffffffffeb80,
              (int *)CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb80);
  local_ae1 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_b08,&local_b30);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc27bb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ae0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_b60);
    testing::Message::~Message((Message *)0xdc2890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc2927);
  local_b74 = 1;
  local_b84 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  local_b80 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count<int>((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(index,uVar6),(int *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(uint *)CONCAT44(iVar4,uVar7),
             (unsigned_long *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc29fd);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc2a60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc2ad1);
  local_bdc = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range<int>(in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_bd8);
  local_bf1 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc2b6b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bf0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_c28);
    testing::Message::~Message((Message *)0xdc2c40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc2cd7);
  local_c40 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key(this_02);
  local_c48 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(iVar4,uVar7),index);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(pair<int,_int> *)CONCAT44(iVar4,uVar7),
             (pair<int,_int> *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc2d9d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc2e00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc2e6e);
  google::
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(index,uVar6));
  local_c69 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc2eb2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_ca0);
    testing::Message::~Message((Message *)0xdc2f87);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc301e);
  local_cdc = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find<int>(in_stack_ffffffffffffeb80,
              (int *)CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb80);
  local_cb1 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_cd8,&local_d00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc30c5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cb0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_d30);
    testing::Message::~Message((Message *)0xdc319a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc3231);
  local_d44 = 0;
  local_d54 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  this_00 = (BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)google::
               BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count<int>((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(index,uVar6),(int *)this_02);
  local_d50 = this_00;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(uint *)CONCAT44(iVar4,uVar7),
             (unsigned_long *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    in_stack_ffffffffffffec08 =
         (int *)testing::AssertionResult::failure_message((AssertionResult *)0xdc3316);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc3379);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc33ea);
  local_dac = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range<int>(this_00,in_stack_ffffffffffffec08);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)local_48,&local_da8);
  local_dc1 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(const_iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc3493);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_dc0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_df8);
    testing::Message::~Message((Message *)0xdc3568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc35ff);
  local_e34 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find<int>(in_stack_ffffffffffffeb80,
              (int *)CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb80);
  local_e09 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_e30,&local_e58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc3693);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e08);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_e88);
    testing::Message::~Message((Message *)0xdc3768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc37ff);
  local_e9c = 0;
  local_eac = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  local_ea8 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count<int>((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(index,uVar6),(int *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(uint *)CONCAT44(iVar4,uVar7),
             (unsigned_long *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc38d5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc3938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc39a9);
  local_f04 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range<int>(this_00,in_stack_ffffffffffffec08);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_f00);
  local_f19 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc3a43);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffebb8,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
               (Message *)in_stack_ffffffffffffebb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_f50);
    testing::Message::~Message((Message *)0xdc3b18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc3baf);
  assertion_result = (AssertionResult *)(in_RDI + 0x10);
  iVar2 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueLookupKey(this_03,iVar4);
  local_f8c = iVar2;
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find<int>(in_stack_ffffffffffffeb80,
              (int *)CONCAT44(in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb80);
  local_f61 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_f88,&local_fb0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc3c56);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffeba8,in_stack_ffffffffffffeba0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_ffffffffffffebc0),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_fe0);
    testing::Message::~Message((Message *)0xdc3d2b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc3dc2);
  local_ff4 = 0;
  actual_predicate_value = (char *)(in_RDI + 0x10);
  iVar3 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueLookupKey(this_03,iVar4);
  local_1004 = iVar3;
  expected_predicate_value =
       (char *)google::
               BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count<int>((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(index,uVar6),(int *)this_02);
  local_1000 = expected_predicate_value;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(uint *)CONCAT44(iVar4,uVar7),
             (unsigned_long *)CONCAT44(index,uVar6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ff0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::AssertionResult::failure_message((AssertionResult *)0xdc3e95);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_ffffffffffffebc0),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc3ef2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc3f63);
  local_105c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range<int>(this_00,in_stack_ffffffffffffec08);
  this_05 = (BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_48;
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_05,&local_1058);
  local_1071 = google::
               dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_05,(const_iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc3ffa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1070);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT44(iVar3,in_stack_ffffffffffffebb0),
               actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_ffffffffffffebc0),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_10a8);
    testing::Message::~Message((Message *)0xdc40cf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc4166);
  local_10e4 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueLookupKey(this_03,iVar4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find<int>(this_05,(int *)CONCAT44(local_10e4,in_stack_ffffffffffffeb78));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_05);
  local_10b9 = google::
               dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==(&local_10e0,&local_1108);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc41f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT44(iVar3,in_stack_ffffffffffffebb0),
               actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb70,type,
               (char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_ffffffffffffebc0),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_1138);
    testing::Message::~Message((Message *)0xdc42c9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc4360);
  local_114c = 0;
  local_115c = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueLookupKey(this_03,iVar4);
  this_01 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::count<int>((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(index,uVar6),(int *)this_02);
  local_1158 = this_01;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb58,(char *)this_03,(uint *)CONCAT44(iVar4,uVar7),
             (unsigned_long *)CONCAT44(index,uVar6));
  iVar8 = (int)((ulong)in_stack_ffffffffffffeb58 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1148);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0xdc442a);
    type = (Type)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,(char *)CONCAT44(in_stack_ffffffffffffeb64,in_stack_ffffffffffffeb60),
               iVar8,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_ffffffffffffebc0),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    testing::Message::~Message((Message *)0xdc4487);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc44f8);
  iVar4 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueLookupKey(this_03,iVar4);
  local_11b4 = iVar4;
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range<int>(this_00,in_stack_ffffffffffffec08);
  this_04 = &local_88;
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(this_04,&local_11b0);
  local_11c9 = google::
               dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_04,&local_88.second.super_const_iterator);
  iVar8 = (int)((ulong)this_04 >> 0x20);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(index,uVar6),(bool *)this_02,(type *)0xdc4586);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11c8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT44(iVar3,in_stack_ffffffffffffebb0),
               actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,(char *)CONCAT44(iVar4,in_stack_ffffffffffffeb60),iVar8,(char *)this_03)
    ;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,in_stack_ffffffffffffebc0),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(index,uVar6));
    std::__cxx11::string::~string(local_1200);
    testing::Message::~Message((Message *)0xdc465b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdc46ef);
  google::
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xdc46fc);
  return;
}

Assistant:

TYPED_TEST(HashtableHeterogeneousLookupTest, HeterogeneousFindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueLookupKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueLookupKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueLookupKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueLookupKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueLookupKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueLookupKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueLookupKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueLookupKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueLookupKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueLookupKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueLookupKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueLookupKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueLookupKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueLookupKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueLookupKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueLookupKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueLookupKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueLookupKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueLookupKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueLookupKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueLookupKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueLookupKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueLookupKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueLookupKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueLookupKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueLookupKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueLookupKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueLookupKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}